

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ContentColumns(sqlite3 *db,char *zDb,char *zTbl,char ***pazCol,int *pnCol,int *pnStr,
                      char **pzErr)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  int n;
  char *zCol_1;
  char *p;
  char *zCol;
  int i;
  int nCol;
  sqlite3_int64 nStr;
  char **azCol;
  sqlite3_stmt *pStmt;
  char *zSql;
  int *piStack_38;
  int rc;
  int *pnStr_local;
  int *pnCol_local;
  char ***pazCol_local;
  char *zTbl_local;
  char *zDb_local;
  sqlite3 *db_local;
  
  zSql._4_4_ = 0;
  azCol = (char **)0x0;
  piStack_38 = pnStr;
  pnStr_local = pnCol;
  pnCol_local = (int *)pazCol;
  pazCol_local = (char ***)zTbl;
  zTbl_local = zDb;
  zDb_local = (char *)db;
  pStmt = (sqlite3_stmt *)sqlite3_mprintf("SELECT * FROM %Q.%Q",zDb,zTbl);
  if (pStmt == (sqlite3_stmt *)0x0) {
    zSql._4_4_ = 7;
  }
  else {
    zSql._4_4_ = sqlite3_prepare((sqlite3 *)zDb_local,(char *)pStmt,-1,(sqlite3_stmt **)&azCol,
                                 (char **)0x0);
    if (zSql._4_4_ != 0) {
      pcVar3 = sqlite3_errmsg((sqlite3 *)zDb_local);
      sqlite3Fts3ErrMsg(pzErr,"%s",pcVar3);
    }
  }
  sqlite3_free(pStmt);
  if (zSql._4_4_ == 0) {
    _i = 0;
    iVar1 = sqlite3_column_count((sqlite3_stmt *)azCol);
    for (zCol._0_4_ = 0; (int)zCol < iVar1; zCol._0_4_ = (int)zCol + 1) {
      pcVar3 = sqlite3_column_name((sqlite3_stmt *)azCol,(int)zCol);
      sVar4 = strlen(pcVar3);
      _i = sVar4 + 1 + _i;
    }
    pvVar5 = sqlite3_malloc64((long)iVar1 * 8 + _i);
    if (pvVar5 == (void *)0x0) {
      zSql._4_4_ = 7;
    }
    else {
      zCol_1 = (char *)((long)pvVar5 + (long)iVar1 * 8);
      for (zCol._0_4_ = 0; (int)zCol < iVar1; zCol._0_4_ = (int)zCol + 1) {
        pcVar3 = sqlite3_column_name((sqlite3_stmt *)azCol,(int)zCol);
        sVar4 = strlen(pcVar3);
        iVar2 = (int)sVar4 + 1;
        memcpy(zCol_1,pcVar3,(long)iVar2);
        *(char **)((long)pvVar5 + (long)(int)zCol * 8) = zCol_1;
        zCol_1 = zCol_1 + iVar2;
      }
    }
    sqlite3_finalize((sqlite3_stmt *)azCol);
    *pnStr_local = iVar1;
    *piStack_38 = (int)_i;
    *(void **)pnCol_local = pvVar5;
  }
  return zSql._4_4_;
}

Assistant:

static int fts3ContentColumns(
  sqlite3 *db,                    /* Database handle */
  const char *zDb,                /* Name of db (i.e. "main", "temp" etc.) */
  const char *zTbl,               /* Name of content table */
  const char ***pazCol,           /* OUT: Malloc'd array of column names */
  int *pnCol,                     /* OUT: Size of array *pazCol */
  int *pnStr,                     /* OUT: Bytes of string content */
  char **pzErr                    /* OUT: error message */
){
  int rc = SQLITE_OK;             /* Return code */
  char *zSql;                     /* "SELECT *" statement on zTbl */  
  sqlite3_stmt *pStmt = 0;        /* Compiled version of zSql */

  zSql = sqlite3_mprintf("SELECT * FROM %Q.%Q", zDb, zTbl);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
    if( rc!=SQLITE_OK ){
      sqlite3Fts3ErrMsg(pzErr, "%s", sqlite3_errmsg(db));
    }
  }
  sqlite3_free(zSql);

  if( rc==SQLITE_OK ){
    const char **azCol;           /* Output array */
    sqlite3_int64 nStr = 0;       /* Size of all column names (incl. 0x00) */
    int nCol;                     /* Number of table columns */
    int i;                        /* Used to iterate through columns */

    /* Loop through the returned columns. Set nStr to the number of bytes of
    ** space required to store a copy of each column name, including the
    ** nul-terminator byte.  */
    nCol = sqlite3_column_count(pStmt);
    for(i=0; i<nCol; i++){
      const char *zCol = sqlite3_column_name(pStmt, i);
      nStr += strlen(zCol) + 1;
    }

    /* Allocate and populate the array to return. */
    azCol = (const char **)sqlite3_malloc64(sizeof(char *) * nCol + nStr);
    if( azCol==0 ){
      rc = SQLITE_NOMEM;
    }else{
      char *p = (char *)&azCol[nCol];
      for(i=0; i<nCol; i++){
        const char *zCol = sqlite3_column_name(pStmt, i);
        int n = (int)strlen(zCol)+1;
        memcpy(p, zCol, n);
        azCol[i] = p;
        p += n;
      }
    }
    sqlite3_finalize(pStmt);

    /* Set the output variables. */
    *pnCol = nCol;
    *pnStr = nStr;
    *pazCol = azCol;
  }

  return rc;
}